

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O0

int LogLuvVGetField(TIFF *tif,uint32_t tag,__va_list_tag *ap)

{
  undefined4 uVar1;
  uint uVar2;
  undefined8 *local_50;
  LogLuvState *sp;
  __va_list_tag *ap_local;
  uint32_t tag_local;
  TIFF *tif_local;
  
  if (tag == 0x10018) {
    uVar1 = *(undefined4 *)(tif->tif_data + 4);
    uVar2 = ap->gp_offset;
    if (uVar2 < 0x29) {
      local_50 = (undefined8 *)((long)(int)uVar2 + (long)ap->reg_save_area);
      ap->gp_offset = uVar2 + 8;
    }
    else {
      local_50 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = local_50 + 1;
    }
    *(undefined4 *)*local_50 = uVar1;
    tif_local._4_4_ = 1;
  }
  else {
    tif_local._4_4_ = (**(code **)(tif->tif_data + 0x28))(tif,tag,ap);
  }
  return tif_local._4_4_;
}

Assistant:

static int LogLuvVGetField(TIFF *tif, uint32_t tag, va_list ap)
{
    LogLuvState *sp = (LogLuvState *)tif->tif_data;

    switch (tag)
    {
        case TIFFTAG_SGILOGDATAFMT:
            *va_arg(ap, int *) = sp->user_datafmt;
            return (1);
        default:
            return (*sp->vgetparent)(tif, tag, ap);
    }
}